

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

void drmp3_L3_midside_stereo(float *left,int n)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  
  for (lVar10 = 0; lVar10 < n + -3; lVar10 = lVar10 + 4) {
    pfVar1 = left + lVar10;
    fVar2 = *pfVar1;
    fVar3 = pfVar1[1];
    fVar4 = pfVar1[2];
    fVar5 = pfVar1[3];
    pfVar1 = left + lVar10 + 0x240;
    fVar6 = *pfVar1;
    fVar7 = pfVar1[1];
    fVar8 = pfVar1[2];
    fVar9 = pfVar1[3];
    pfVar1 = left + lVar10;
    *pfVar1 = fVar2 + fVar6;
    pfVar1[1] = fVar3 + fVar7;
    pfVar1[2] = fVar4 + fVar8;
    pfVar1[3] = fVar5 + fVar9;
    pfVar1 = left + lVar10 + 0x240;
    *pfVar1 = fVar2 - fVar6;
    pfVar1[1] = fVar3 - fVar7;
    pfVar1[2] = fVar4 - fVar8;
    pfVar1[3] = fVar5 - fVar9;
  }
  for (; lVar10 < n; lVar10 = lVar10 + 1) {
    fVar2 = left[lVar10];
    left[lVar10] = fVar2 + left[lVar10 + 0x240];
    left[lVar10 + 0x240] = fVar2 - left[lVar10 + 0x240];
  }
  return;
}

Assistant:

static void drmp3_L3_midside_stereo(float *left, int n)
{
    int i = 0;
    float *right = left + 576;
#if DRMP3_HAVE_SIMD
    if (drmp3_have_simd()) for (; i < n - 3; i += 4)
        {
            drmp3_f4 vl = DRMP3_VLD(left + i);
            drmp3_f4 vr = DRMP3_VLD(right + i);
            DRMP3_VSTORE(left + i, DRMP3_VADD(vl, vr));
            DRMP3_VSTORE(right + i, DRMP3_VSUB(vl, vr));
        }
#endif
    for (; i < n; i++)
    {
        float a = left[i];
        float b = right[i];
        left[i] = a + b;
        right[i] = a - b;
    }
}